

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O1

char * uo_json_find_str_end(char *json_str)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  
  pcVar4 = json_str + 1;
  while( true ) {
    pcVar4 = strchr(pcVar4,0x22);
    if (pcVar4 == (char *)0x0) break;
    pcVar2 = pcVar4;
    bVar1 = false;
    do {
      bVar3 = bVar1;
      pcVar2 = pcVar2 + -1;
      bVar1 = (bool)(bVar3 ^ 1);
    } while (*pcVar2 == '\\');
    if (!bVar3) break;
    pcVar4 = pcVar4 + 1;
  }
  pcVar2 = (char *)0x0;
  if (pcVar4 != (char *)0x0) {
    pcVar2 = pcVar4 + 1;
  }
  return pcVar2;
}

Assistant:

static char *uo_json_find_str_end(
    const char *json_str)
{
    const char *quote = strchr(json_str + 1, '\"');

    while (quote && uo_json_is_char_escaped(quote))
        quote = strchr(quote + 1, '\"');

    return quote
        ? (char *)quote + 1
        : NULL;
}